

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtptngen.cpp
# Opt level: O1

DateTimeMatcher * __thiscall icu_63::PatternMapIterator::next(PatternMapIterator *this)

{
  DateTimeMatcher *pDVar1;
  PtnSkeleton *pPVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  int iVar10;
  PtnElem *pPVar11;
  PtnElem *pPVar12;
  
  iVar10 = this->bootIndex;
  if (iVar10 < 0x34) {
    pPVar11 = this->nodePtr;
    do {
      if (pPVar11 == (PtnElem *)0x0) {
        pPVar12 = this->patternMap->boot[iVar10];
        if (pPVar12 != (PtnElem *)0x0) goto LAB_002eccb7;
        this->bootIndex = iVar10 + 1;
      }
      else {
        pPVar12 = (pPVar11->next).super_LocalPointerBase<icu_63::PtnElem>.ptr;
        if (pPVar12 != (PtnElem *)0x0) {
LAB_002eccb7:
          this->nodePtr = pPVar12;
          break;
        }
        this->bootIndex = iVar10 + 1;
        this->nodePtr = (PtnElem *)0x0;
        pPVar11 = (PtnElem *)0x0;
      }
      iVar10 = iVar10 + 1;
    } while (iVar10 < 0x34);
  }
  pDVar1 = (this->matcher).super_LocalPointerBase<icu_63::DateTimeMatcher>.ptr;
  if (this->nodePtr == (PtnElem *)0x0) {
    (pDVar1->skeleton).baseOriginal.lengths[0] = '\0';
    (pDVar1->skeleton).baseOriginal.lengths[1] = '\0';
    (pDVar1->skeleton).baseOriginal.lengths[2] = '\0';
    (pDVar1->skeleton).baseOriginal.lengths[3] = '\0';
    (pDVar1->skeleton).baseOriginal.lengths[4] = '\0';
    (pDVar1->skeleton).baseOriginal.lengths[5] = '\0';
    (pDVar1->skeleton).baseOriginal.lengths[6] = '\0';
    (pDVar1->skeleton).baseOriginal.lengths[7] = '\0';
    pPVar2 = &pDVar1->skeleton;
    (pPVar2->baseOriginal).lengths[8] = '\0';
    (pPVar2->baseOriginal).lengths[9] = '\0';
    (pPVar2->baseOriginal).lengths[10] = '\0';
    (pPVar2->baseOriginal).lengths[0xb] = '\0';
    (pPVar2->baseOriginal).lengths[0xc] = '\0';
    (pPVar2->baseOriginal).lengths[0xd] = '\0';
    (pPVar2->baseOriginal).lengths[0xe] = '\0';
    (pPVar2->baseOriginal).lengths[0xf] = '\0';
    (pDVar1->skeleton).baseOriginal.chars[0] = '\0';
    (pDVar1->skeleton).baseOriginal.chars[1] = '\0';
    (pDVar1->skeleton).baseOriginal.chars[2] = '\0';
    (pDVar1->skeleton).baseOriginal.chars[3] = '\0';
    (pDVar1->skeleton).baseOriginal.chars[4] = '\0';
    (pDVar1->skeleton).baseOriginal.chars[5] = '\0';
    (pDVar1->skeleton).baseOriginal.chars[6] = '\0';
    (pDVar1->skeleton).baseOriginal.chars[7] = '\0';
    pPVar2 = &pDVar1->skeleton;
    (pPVar2->baseOriginal).chars[8] = '\0';
    (pPVar2->baseOriginal).chars[9] = '\0';
    (pPVar2->baseOriginal).chars[10] = '\0';
    (pPVar2->baseOriginal).chars[0xb] = '\0';
    (pPVar2->baseOriginal).chars[0xc] = '\0';
    (pPVar2->baseOriginal).chars[0xd] = '\0';
    (pPVar2->baseOriginal).chars[0xe] = '\0';
    (pPVar2->baseOriginal).chars[0xf] = '\0';
    (pDVar1->skeleton).original.lengths[0] = '\0';
    (pDVar1->skeleton).original.lengths[1] = '\0';
    (pDVar1->skeleton).original.lengths[2] = '\0';
    (pDVar1->skeleton).original.lengths[3] = '\0';
    (pDVar1->skeleton).original.lengths[4] = '\0';
    (pDVar1->skeleton).original.lengths[5] = '\0';
    (pDVar1->skeleton).original.lengths[6] = '\0';
    (pDVar1->skeleton).original.lengths[7] = '\0';
    pPVar2 = &pDVar1->skeleton;
    (pPVar2->original).lengths[8] = '\0';
    (pPVar2->original).lengths[9] = '\0';
    (pPVar2->original).lengths[10] = '\0';
    (pPVar2->original).lengths[0xb] = '\0';
    (pPVar2->original).lengths[0xc] = '\0';
    (pPVar2->original).lengths[0xd] = '\0';
    (pPVar2->original).lengths[0xe] = '\0';
    (pPVar2->original).lengths[0xf] = '\0';
    (pDVar1->skeleton).original.chars[0] = '\0';
    (pDVar1->skeleton).original.chars[1] = '\0';
    (pDVar1->skeleton).original.chars[2] = '\0';
    (pDVar1->skeleton).original.chars[3] = '\0';
    (pDVar1->skeleton).original.chars[4] = '\0';
    (pDVar1->skeleton).original.chars[5] = '\0';
    (pDVar1->skeleton).original.chars[6] = '\0';
    (pDVar1->skeleton).original.chars[7] = '\0';
    pPVar2 = &pDVar1->skeleton;
    (pPVar2->original).chars[8] = '\0';
    (pPVar2->original).chars[9] = '\0';
    (pPVar2->original).chars[10] = '\0';
    (pPVar2->original).chars[0xb] = '\0';
    (pPVar2->original).chars[0xc] = '\0';
    (pPVar2->original).chars[0xd] = '\0';
    (pPVar2->original).chars[0xe] = '\0';
    (pPVar2->original).chars[0xf] = '\0';
    (pDVar1->skeleton).type[0xc] = 0;
    (pDVar1->skeleton).type[0xd] = 0;
    (pDVar1->skeleton).type[0xe] = 0;
    (pDVar1->skeleton).type[0xf] = 0;
    (pDVar1->skeleton).type[8] = 0;
    (pDVar1->skeleton).type[9] = 0;
    (pDVar1->skeleton).type[10] = 0;
    (pDVar1->skeleton).type[0xb] = 0;
    (pDVar1->skeleton).type[4] = 0;
    (pDVar1->skeleton).type[5] = 0;
    (pDVar1->skeleton).type[6] = 0;
    (pDVar1->skeleton).type[7] = 0;
    (pDVar1->skeleton).type[0] = 0;
    (pDVar1->skeleton).type[1] = 0;
    (pDVar1->skeleton).type[2] = 0;
    (pDVar1->skeleton).type[3] = 0;
  }
  else {
    pPVar2 = (this->nodePtr->skeleton).super_LocalPointerBase<icu_63::PtnSkeleton>.ptr;
    uVar3 = *(undefined8 *)pPVar2->type;
    uVar4 = *(undefined8 *)(pPVar2->type + 2);
    uVar5 = *(undefined8 *)(pPVar2->type + 4);
    uVar6 = *(undefined8 *)(pPVar2->type + 6);
    uVar7 = *(undefined8 *)(pPVar2->type + 8);
    uVar8 = *(undefined8 *)(pPVar2->type + 10);
    uVar9 = *(undefined8 *)(pPVar2->type + 0xe);
    *(undefined8 *)((pDVar1->skeleton).type + 0xc) = *(undefined8 *)(pPVar2->type + 0xc);
    *(undefined8 *)((pDVar1->skeleton).type + 0xe) = uVar9;
    *(undefined8 *)((pDVar1->skeleton).type + 8) = uVar7;
    *(undefined8 *)((pDVar1->skeleton).type + 10) = uVar8;
    *(undefined8 *)((pDVar1->skeleton).type + 4) = uVar5;
    *(undefined8 *)((pDVar1->skeleton).type + 6) = uVar6;
    *(undefined8 *)(pDVar1->skeleton).type = uVar3;
    *(undefined8 *)((pDVar1->skeleton).type + 2) = uVar4;
    uVar3 = *(undefined8 *)((pPVar2->original).chars + 8);
    *(undefined8 *)(pDVar1->skeleton).original.chars = *(undefined8 *)(pPVar2->original).chars;
    *(undefined8 *)((pDVar1->skeleton).original.chars + 8) = uVar3;
    uVar3 = *(undefined8 *)((pPVar2->original).lengths + 8);
    *(undefined8 *)(pDVar1->skeleton).original.lengths = *(undefined8 *)(pPVar2->original).lengths;
    *(undefined8 *)((pDVar1->skeleton).original.lengths + 8) = uVar3;
    uVar3 = *(undefined8 *)((pPVar2->baseOriginal).chars + 8);
    *(undefined8 *)(pDVar1->skeleton).baseOriginal.chars =
         *(undefined8 *)(pPVar2->baseOriginal).chars;
    *(undefined8 *)((pDVar1->skeleton).baseOriginal.chars + 8) = uVar3;
    uVar3 = *(undefined8 *)((pPVar2->baseOriginal).lengths + 8);
    *(undefined8 *)(pDVar1->skeleton).baseOriginal.lengths =
         *(undefined8 *)(pPVar2->baseOriginal).lengths;
    *(undefined8 *)((pDVar1->skeleton).baseOriginal.lengths + 8) = uVar3;
  }
  return (this->matcher).super_LocalPointerBase<icu_63::DateTimeMatcher>.ptr;
}

Assistant:

DateTimeMatcher&
PatternMapIterator::next() {
    while ( bootIndex < MAX_PATTERN_ENTRIES ) {
        if ( nodePtr != nullptr ) {
            if ( nodePtr->next != nullptr ) {
                nodePtr = nodePtr->next.getAlias();
                break;
            }
            else {
                bootIndex++;
                nodePtr=nullptr;
                continue;
            }
        }
        else {
            if ( patternMap->boot[bootIndex] != nullptr ) {
                nodePtr = patternMap->boot[bootIndex];
                break;
            }
            else {
                bootIndex++;
                continue;
            }
        }
    }
    if (nodePtr!=nullptr) {
        matcher->copyFrom(*nodePtr->skeleton);
    }
    else {
        matcher->copyFrom();
    }
    return *matcher;
}